

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# encoding.c
# Opt level: O0

long xmlByteConsumed(xmlParserCtxtPtr ctxt)

{
  xmlCharEncError xVar1;
  int local_44;
  int ret;
  int toconv;
  uchar *cur;
  uchar *convbuf;
  xmlCharEncodingHandler *handler;
  xmlParserInputPtr pxStack_20;
  int unused;
  xmlParserInputPtr in;
  xmlParserCtxtPtr ctxt_local;
  
  if (ctxt == (xmlParserCtxtPtr)0x0) {
    ctxt_local = (xmlParserCtxtPtr)0xffffffffffffffff;
  }
  else {
    pxStack_20 = ctxt->input;
    if (pxStack_20 == (xmlParserInputPtr)0x0) {
      ctxt_local = (xmlParserCtxtPtr)0xffffffffffffffff;
    }
    else if ((pxStack_20->buf == (xmlParserInputBufferPtr)0x0) ||
            (pxStack_20->buf->encoder == (xmlCharEncodingHandlerPtr)0x0)) {
      ctxt_local = (xmlParserCtxtPtr)
                   (pxStack_20->cur + (pxStack_20->consumed - (long)pxStack_20->base));
    }
    else {
      handler._4_4_ = 0;
      convbuf = (uchar *)pxStack_20->buf->encoder;
      if (0 < (long)pxStack_20->end - (long)pxStack_20->cur) {
        _ret = pxStack_20->cur;
        in = (xmlParserInputPtr)ctxt;
        cur = (uchar *)(*xmlMalloc)(32000);
        if (cur == (uchar *)0x0) {
          return -1;
        }
        local_44 = (int)pxStack_20->end - (int)_ret;
        handler._4_4_ = 32000;
        xVar1 = xmlEncOutputChunk((xmlCharEncodingHandler *)convbuf,cur,(int *)((long)&handler + 4),
                                  _ret,&local_44);
        (*xmlFree)(cur);
        if (xVar1 != XML_ENC_ERR_SUCCESS) {
          return -1;
        }
      }
      if (pxStack_20->buf->rawconsumed < (ulong)(long)handler._4_4_) {
        ctxt_local = (xmlParserCtxtPtr)0xffffffffffffffff;
      }
      else {
        ctxt_local = (xmlParserCtxtPtr)(pxStack_20->buf->rawconsumed - (long)handler._4_4_);
      }
    }
  }
  return (long)ctxt_local;
}

Assistant:

long
xmlByteConsumed(xmlParserCtxtPtr ctxt) {
    xmlParserInputPtr in;

    if (ctxt == NULL)
        return(-1);
    in = ctxt->input;
    if (in == NULL)
        return(-1);

    if ((in->buf != NULL) && (in->buf->encoder != NULL)) {
        int unused = 0;
	xmlCharEncodingHandler * handler = in->buf->encoder;

        /*
	 * Encoding conversion, compute the number of unused original
	 * bytes from the input not consumed and subtract that from
	 * the raw consumed value, this is not a cheap operation
	 */
        if (in->end - in->cur > 0) {
	    unsigned char *convbuf;
	    const unsigned char *cur = (const unsigned char *)in->cur;
	    int toconv, ret;

            convbuf = xmlMalloc(32000);
            if (convbuf == NULL)
                return(-1);

            toconv = in->end - cur;
            unused = 32000;
            ret = xmlEncOutputChunk(handler, convbuf, &unused, cur, &toconv);

            xmlFree(convbuf);

            if (ret != XML_ENC_ERR_SUCCESS)
                return(-1);
	}

	if (in->buf->rawconsumed < (unsigned long) unused)
	    return(-1);
	return(in->buf->rawconsumed - unused);
    }

    return(in->consumed + (in->cur - in->base));
}